

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall Timer::start(Timer *this)

{
  Runnable<Timer> *this_00;
  
  if (this->mClockThread != (Runnable<Timer> *)0x0) {
    return;
  }
  reset(this);
  this_00 = (Runnable<Timer> *)
            operator_new(0x58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                         ,0x5e);
  JHThread::Thread::Thread((Thread *)this_00,"clockThread",0);
  (this_00->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_00130a38;
  this_00->mObject = this;
  this_00->mFunc = (thread_main_type)clockHandler;
  *(undefined8 *)&this_00->field_0x48 = 0;
  this_00->mStop = false;
  this_00->mHardStop = false;
  this->mClockThread = this_00;
  JHThread::Thread::Start((Thread *)this_00);
  return;
}

Assistant:

void Timer::start()
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	// If the clock thread is already running then the
	if (mClockThread != NULL)
		return;
	
	// Because we don't prevent additions to our timer list during
	// periods where the timer is stopped we need to reset, which
	// clears the timeout list and resets ticks to 0
	reset();
	
	mClockThread = jh_new Runnable<Timer>("clockThread",
										  this,
										  &Timer::clockHandler);
	mClockThread->Start();
	
}